

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O3

void __thiscall
glcts::TextureBufferActiveUniformValidationCS::configureProgram
          (TextureBufferActiveUniformValidationCS *this,
          vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_> *params,
          GLuint *texIds)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  pointer pTVar2;
  ulong uVar3;
  ulong uVar4;
  
  iVar1 = (*((this->super_TextureBufferActiveUniformValidation).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  pTVar2 = (params->
           super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((params->
      super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>).
      _M_impl.super__Vector_impl_data._M_finish != pTVar2) {
    uVar4 = 0;
    do {
      (**(code **)(CONCAT44(extraout_var,iVar1) + 0x80))
                (uVar4,texIds[uVar4],0,0,0,0x88b9,pTVar2[uVar4].m_texture_format);
      err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
      glu::checkError(err,"Error binding texture to image unit!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                      ,0x2b1);
      uVar4 = (ulong)((int)uVar4 + 1);
      pTVar2 = (params->
               super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar3 = ((long)(params->
                     super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 4) *
              -0x5555555555555555;
    } while (uVar4 <= uVar3 && uVar3 - uVar4 != 0);
  }
  return;
}

Assistant:

void TextureBufferActiveUniformValidationCS::configureProgram(std::vector<TextureParameters>* params,
															  glw::GLuint*					  texIds)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (glw::GLuint i = 0; i < params->size(); ++i)
	{
		gl.bindImageTexture(i, texIds[i], 0, GL_FALSE, 0, GL_WRITE_ONLY, (*params)[i].get_texture_format());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture to image unit!");
	}
}